

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTaskManager.hpp
# Opt level: O1

void __thiscall sftm::CTaskManager::Stop(CTaskManager *this)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  timespec local_38;
  
  uVar4 = this->m_nWorkerCount;
  if (uVar4 != 0) {
    uVar3 = 1;
    do {
      (this->m_workers)._M_elems[uVar3].m_bStopping = true;
      uVar3 = uVar3 + 1;
    } while (uVar3 <= uVar4);
  }
  if (this->m_nWorkerCount != 0) {
    uVar5 = 1;
    do {
      if ((this->m_workers)._M_elems[uVar5].m_bFinished == false) {
        do {
          local_38.tv_sec = 0;
          local_38.tv_nsec = 10000000;
          do {
            iVar1 = nanosleep(&local_38,&local_38);
            if (iVar1 != -1) break;
            piVar2 = __errno_location();
          } while (*piVar2 == 4);
          std::condition_variable::notify_all();
        } while ((this->m_workers)._M_elems[uVar5].m_bFinished != true);
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 <= this->m_nWorkerCount);
  }
  return;
}

Assistant:

void Stop() noexcept
		{
			for (std::uint32_t nWorker = 1; nWorker <= m_nWorkerCount; nWorker++)
				m_workers[nWorker].Stop();

			for (std::uint32_t nWorker = 1; nWorker <= m_nWorkerCount; nWorker++)
			{
				while (!m_workers[nWorker].IsFinished())
				{
					std::this_thread::sleep_for(std::chrono::milliseconds(10));
					m_cvWorkerIdle.notify_all();
				}
			}
		}